

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O2

char * strpool_collate(strpool_t *pool,int *count)

{
  strpool_internal_entry_t *psVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  void *__src;
  long lVar7;
  int i;
  long lVar8;
  char *__dest;
  
  uVar4 = 0;
  uVar2 = (ulong)(uint)pool->entry_count;
  if (pool->entry_count < 1) {
    uVar2 = uVar4;
  }
  iVar5 = 0;
  for (; uVar2 * 0x20 != uVar4; uVar4 = uVar4 + 0x20) {
    iVar5 = iVar5 + *(int *)((long)&pool->entries->length + uVar4) + 1;
  }
  if (iVar5 == 0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = (char *)(**pool->memctx)(0,(long)iVar5,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8))
    ;
    if (pcVar3 == (char *)0x0) {
      __assert_fail("strings",
                    "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                    ,0x4b9,"char *strpool_collate(const strpool_t *, int *)");
    }
    iVar5 = pool->entry_count;
    *count = iVar5;
    lVar7 = 8;
    __dest = pcVar3;
    for (lVar8 = 0; lVar8 < iVar5; lVar8 = lVar8 + 1) {
      psVar1 = pool->entries;
      lVar6 = (long)*(int *)((long)&psVar1->data + lVar7 + 4);
      __src = (void *)(*(long *)((long)&psVar1->hash_slot + lVar7) + 8);
      *(void **)((long)&psVar1->hash_slot + lVar7) = __src;
      memcpy(__dest,__src,lVar6 + 1);
      __dest = __dest + lVar6 + 1;
      iVar5 = pool->entry_count;
      lVar7 = lVar7 + 0x20;
    }
  }
  return pcVar3;
}

Assistant:

char* strpool_collate( strpool_t const* pool, int* count )
    {
    int size = 0;
    for( int i = 0; i < pool->entry_count; ++i ) size += pool->entries[ i ].length + 1;
    if( size == 0 ) return NULL;

    char* strings = (char*) STRPOOL_MALLOC( pool->memctx, (size_t) size );
    STRPOOL_ASSERT( strings );
    *count = pool->entry_count;
    char* ptr = strings;
    for( int i = 0; i < pool->entry_count; ++i )
        {
        int len = pool->entries[ i ].length + 1;
        char* src = pool->entries[ i ].data += 2 * sizeof( STRPOOL_U32 );
        STRPOOL_MEMCPY( ptr, src, (size_t) len );
        ptr += len;
        }
    return strings;
    }